

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::GenDefFile
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *real_link_commands)

{
  cmGeneratorTarget *this_00;
  cmLocalUnixMakefileGenerator3 *pcVar1;
  pointer pbVar2;
  pointer ppcVar3;
  bool bVar4;
  string *psVar5;
  ModuleDefinitionInfo *remote_path;
  ostream *poVar6;
  string *obj;
  pointer pbVar7;
  pointer ppcVar8;
  string objlist_file;
  string cmd;
  cmGeneratedFileStream fout;
  string local_2e0;
  ModuleDefinitionInfo *local_2c0;
  string local_2b8;
  string local_298;
  cmGeneratedFileStream local_278;
  
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  psVar5 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmCommonTargetGenerator);
  remote_path = cmGeneratorTarget::GetModuleDefinitionInfo(this_00,psVar5);
  if ((remote_path != (ModuleDefinitionInfo *)0x0) && (remote_path->DefFileGenerated == true)) {
    psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::string((string *)&local_2b8,(string *)psVar5);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&local_278,
               &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_2b8,SHELL);
    std::__cxx11::string::operator=((string *)&local_2b8,(string *)&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::append((char *)&local_2b8);
    pcVar1 = this->LocalGenerator;
    psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar1);
    cmLocalGenerator::MaybeConvertToRelativePath
              (&local_2e0,(cmLocalGenerator *)pcVar1,psVar5,&remote_path->DefFile);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&local_278,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_2e0,SHELL);
    std::__cxx11::string::append((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::append((char *)&local_2b8);
    std::operator+(&local_2e0,&remote_path->DefFile,".objs");
    pcVar1 = this->LocalGenerator;
    psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar1);
    cmLocalGenerator::MaybeConvertToRelativePath
              (&local_298,(cmLocalGenerator *)pcVar1,psVar5,&local_2e0);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&local_278,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_298,SHELL);
    std::__cxx11::string::append((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_298);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(real_link_commands,
             (real_link_commands->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,&local_2b8);
    cmGeneratedFileStream::cmGeneratedFileStream(&local_278,&local_2e0,false,None);
    if (remote_path->WindowsExportAllSymbols == true) {
      pbVar2 = (this->Objects).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_2c0 = remote_path;
      for (pbVar7 = (this->Objects).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; remote_path = local_2c0,
          pbVar7 != pbVar2; pbVar7 = pbVar7 + 1) {
        bVar4 = cmHasLiteralSuffix<std::__cxx11::string,5ul>(pbVar7,(char (*) [5])".obj");
        if (bVar4) {
          poVar6 = std::operator<<((ostream *)&local_278,(string *)pbVar7);
          std::operator<<(poVar6,"\n");
        }
      }
      pbVar2 = (this->ExternalObjects).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar7 = (this->ExternalObjects).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar2; pbVar7 = pbVar7 + 1
          ) {
        poVar6 = std::operator<<((ostream *)&local_278,(string *)pbVar7);
        std::operator<<(poVar6,"\n");
      }
    }
    ppcVar3 = (remote_path->Sources).
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar8 = (remote_path->Sources).
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppcVar8 != ppcVar3;
        ppcVar8 = ppcVar8 + 1) {
      psVar5 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar8);
      poVar6 = std::operator<<((ostream *)&local_278,(string *)psVar5);
      std::operator<<(poVar6,"\n");
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&local_278);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2b8);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::GenDefFile(
  std::vector<std::string>& real_link_commands)
{
  cmGeneratorTarget::ModuleDefinitionInfo const* mdi =
    this->GeneratorTarget->GetModuleDefinitionInfo(this->GetConfigName());
  if (!mdi || !mdi->DefFileGenerated) {
    return;
  }
  std::string cmd = cmSystemTools::GetCMakeCommand();
  cmd =
    this->LocalGenerator->ConvertToOutputFormat(cmd, cmOutputConverter::SHELL);
  cmd += " -E __create_def ";
  cmd += this->LocalGenerator->ConvertToOutputFormat(
    this->LocalGenerator->MaybeConvertToRelativePath(
      this->LocalGenerator->GetCurrentBinaryDirectory(), mdi->DefFile),
    cmOutputConverter::SHELL);
  cmd += " ";
  std::string objlist_file = mdi->DefFile + ".objs";
  cmd += this->LocalGenerator->ConvertToOutputFormat(
    this->LocalGenerator->MaybeConvertToRelativePath(
      this->LocalGenerator->GetCurrentBinaryDirectory(), objlist_file),
    cmOutputConverter::SHELL);
  real_link_commands.insert(real_link_commands.begin(), cmd);
  // create a list of obj files for the -E __create_def to read
  cmGeneratedFileStream fout(objlist_file);

  if (mdi->WindowsExportAllSymbols) {
    for (std::string const& obj : this->Objects) {
      if (cmHasLiteralSuffix(obj, ".obj")) {
        fout << obj << "\n";
      }
    }
    for (std::string const& obj : this->ExternalObjects) {
      fout << obj << "\n";
    }
  }

  for (cmSourceFile const* src : mdi->Sources) {
    fout << src->GetFullPath() << "\n";
  }
}